

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O0

void __thiscall Json_StringAndIteratorAPI_Test::TestBody(Json_StringAndIteratorAPI_Test *this)

{
  json_out_callbacks *pjVar1;
  bool bVar2;
  parser<json_out_callbacks> *ppVar3;
  char *pcVar4;
  const_iterator first;
  char *in_R9;
  AssertHelper local_380;
  Message local_378;
  coord local_370;
  coord local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_3;
  Message local_348;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_310;
  Message local_308;
  bool local_2f9;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_2d8 [8];
  string res_1;
  undefined1 local_298 [8];
  parser<json_out_callbacks> p2;
  Message local_1d8;
  coord local_1d0;
  coord local_1c8;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_1;
  Message local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_170;
  Message local_168;
  bool local_159;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_;
  string res;
  undefined1 local_100 [8];
  parser<json_out_callbacks> p1;
  allocator local_31;
  undefined1 local_30 [8];
  string src;
  Json_StringAndIteratorAPI_Test *this_local;
  
  src.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"null",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  res.field_2._8_8_ = 0;
  pjVar1 = (json_out_callbacks *)((long)&res.field_2 + 8);
  json_out_callbacks::json_out_callbacks(pjVar1);
  pstore::json::parser<json_out_callbacks>::parser
            ((parser<json_out_callbacks> *)local_100,pjVar1,none);
  json_out_callbacks::~json_out_callbacks((json_out_callbacks *)((long)&res.field_2 + 8));
  ppVar3 = pstore::json::parser<json_out_callbacks>::input
                     ((parser<json_out_callbacks> *)local_100,(string *)local_30);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_
            ((result_type *)&gtest_ar_.message_,ppVar3);
  local_159 = pstore::json::parser<json_out_callbacks>::has_error
                        ((parser<json_out_callbacks> *)local_100);
  local_159 = !local_159;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_158,&local_159,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar2) {
    testing::Message::Message(&local_168);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_158,
               (AssertionResult *)"p1.has_error ()","true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x36,pcVar4);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_1a0,"res","\"null\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_.message_,(char (*) [5])0x1f2e6d);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar2) {
    testing::Message::Message(&local_1a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x37,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  local_1c8 = pstore::json::parser<json_out_callbacks>::coordinate
                        ((parser<json_out_callbacks> *)local_100);
  pstore::json::coord::coord(&local_1d0,5,1);
  testing::internal::EqHelper::Compare<pstore::json::coord,_pstore::json::coord,_nullptr>
            ((EqHelper *)local_1c0,"p1.coordinate ()","(json::coord{5U, 1U})",&local_1c8,&local_1d0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar2) {
    testing::Message::Message(&local_1d8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&p2.coordinate_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x38,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&p2.coordinate_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p2.coordinate_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  pstore::json::parser<json_out_callbacks>::~parser((parser<json_out_callbacks> *)local_100);
  res_1.field_2._8_8_ = 0;
  pjVar1 = (json_out_callbacks *)((long)&res_1.field_2 + 8);
  json_out_callbacks::json_out_callbacks(pjVar1);
  pstore::json::parser<json_out_callbacks>::parser
            ((parser<json_out_callbacks> *)local_298,pjVar1,none);
  json_out_callbacks::~json_out_callbacks((json_out_callbacks *)((long)&res_1.field_2 + 8));
  first = std::begin<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )std::end<std::__cxx11::string>
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  ppVar3 = pstore::json::parser<json_out_callbacks>::
           input<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                     ((parser<json_out_callbacks> *)local_298,
                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )first._M_current,
                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_((result_type *)local_2d8,ppVar3);
  local_2f9 = pstore::json::parser<json_out_callbacks>::has_error
                        ((parser<json_out_callbacks> *)local_298);
  local_2f9 = !local_2f9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2f8,&local_2f9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar2) {
    testing::Message::Message(&local_308);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_2f8,
               (AssertionResult *)"p2.has_error ()","true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x3d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_310,&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_340,"res","\"null\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
             (char (*) [5])0x1f2e6d);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar2) {
    testing::Message::Message(&local_348);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x3e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  local_368 = pstore::json::parser<json_out_callbacks>::coordinate
                        ((parser<json_out_callbacks> *)local_298);
  pstore::json::coord::coord(&local_370,5,1);
  testing::internal::EqHelper::Compare<pstore::json::coord,_pstore::json::coord,_nullptr>
            ((EqHelper *)local_360,"p2.coordinate ()","(json::coord{5U, 1U})",&local_368,&local_370)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar2) {
    testing::Message::Message(&local_378);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x3f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_380,&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  std::__cxx11::string::~string((string *)local_2d8);
  pstore::json::parser<json_out_callbacks>::~parser((parser<json_out_callbacks> *)local_298);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F (Json, StringAndIteratorAPI) {
    std::string const src = "null";
    {
        json::parser<json_out_callbacks> p1;
        std::string const res = p1.input (src).eof ();
        EXPECT_FALSE (p1.has_error ());
        EXPECT_EQ (res, "null");
        EXPECT_EQ (p1.coordinate (), (json::coord{5U, 1U}));
    }
    {
        json::parser<json_out_callbacks> p2;
        std::string const res = p2.input (std::begin (src), std::end (src)).eof ();
        EXPECT_FALSE (p2.has_error ());
        EXPECT_EQ (res, "null");
        EXPECT_EQ (p2.coordinate (), (json::coord{5U, 1U}));
    }
}